

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

int Gia_ManMuxProfile(Mux_Man_t *p,int fWidth)

{
  int Counter;
  uint uVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  int i;
  int iVar7;
  uint uVar8;
  
  p_00 = Vec_IntStart(1000);
  if (fWidth == 0) {
    for (iVar5 = 1; iVar5 < p->vTops->nSize; iVar5 = iVar5 + 1) {
      pcVar4 = Abc_NamStr(p->pNames,iVar5);
      iVar7 = atoi(pcVar4);
      if (0x3e6 < iVar7) {
        iVar7 = 999;
      }
      Vec_IntAddToEntry(p_00,iVar7,1);
    }
  }
  else {
    iVar5 = 1;
    while( true ) {
      if (p->vTops->nSize <= iVar5) break;
      pVVar2 = Vec_WecEntry(p->vTops,iVar5);
      iVar7 = pVVar2->nSize;
      if (0x3e6 < iVar7) {
        iVar7 = 999;
      }
      Vec_IntAddToEntry(p_00,iVar7,1);
      iVar5 = iVar5 + 1;
    }
  }
  uVar3 = 0;
  uVar6 = (ulong)(uint)p_00->nSize;
  if (p_00->nSize < 1) {
    uVar6 = uVar3;
  }
  iVar5 = 0;
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    iVar5 = iVar5 + (uint)(0 < p_00->pArray[uVar3]);
  }
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    pcVar4 = "widths";
    if (fWidth == 0) {
      pcVar4 = "sizes";
    }
    printf("The distribution of MUX tree %s:\n",pcVar4);
    iVar7 = 0;
    for (uVar8 = 0; (uint)uVar6 != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = Vec_IntEntry(p_00,uVar8);
      if (uVar1 != 0) {
        iVar7 = iVar7 + 1;
        if (iVar7 == 0xc) {
          putchar(10);
          iVar7 = 0;
        }
        printf("  %d=%d",(ulong)uVar8,(ulong)uVar1);
      }
    }
    printf("\nSummary: ");
    uVar8 = Vec_IntFindMax(p_00);
    printf("Max = %d  ",(ulong)uVar8);
    iVar7 = 0;
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      iVar7 = iVar7 + p_00->pArray[uVar3];
    }
    printf("Ave = %.2f",(double)iVar7 / (double)iVar5);
    putchar(10);
    Vec_IntFree(p_00);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Gia_ManMuxProfile( Mux_Man_t * p, int fWidth )
{
    int i, Entry, Counter, Total;
    Vec_Int_t * vVec, * vCounts;
    vCounts = Vec_IntStart( 1000 );
    if ( fWidth )
    {
        Vec_WecForEachLevelStart( p->vTops, vVec, i, 1 )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(Vec_IntSize(vVec), 999), 1 );
    }
    else
    {
        for ( i = 1; i < Vec_WecSize(p->vTops); i++ )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(atoi(Abc_NamStr(p->pNames, i)), 999), 1 );
    }
    Total = Vec_IntCountPositive(vCounts);
    if ( Total == 0 )
        return 0;
    printf( "The distribution of MUX tree %s:\n", fWidth ? "widths" : "sizes"  );
    Counter = 0;
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( !Entry ) continue;
        if ( ++Counter == 12 )
            printf( "\n" ), Counter = 0;
        printf( "  %d=%d", i, Entry );
    }
    printf( "\nSummary: " );
    printf( "Max = %d  ", Vec_IntFindMax(vCounts) );
    printf( "Ave = %.2f", 1.0*Vec_IntSum(vCounts)/Total );
    printf( "\n" );
    Vec_IntFree( vCounts );
    return 1;
}